

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::SelectUtxos
                   (string *__return_storage_ptr__,string *request_message)

{
  function<void_(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = CoinJsonApi::SelectUtxos;
  local_18._8_8_ =
       std::
       _Function_handler<void_(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*),_void_(*)(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<void_(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*),_void_(*)(cfd::js::api::json::SelectUtxosWrapRequest_*,_cfd::js::api::json::SelectUtxosWrapResponse_*)>
       ::_M_manager;
  ExecuteDirectJsonApi<cfd::js::api::json::SelectUtxosWrapRequest,cfd::js::api::json::SelectUtxosWrapResponse>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::SelectUtxos(const std::string &request_message) {
  return ExecuteDirectJsonApi<
      api::json::SelectUtxosWrapRequest, api::json::SelectUtxosWrapResponse>(
      request_message, CoinJsonApi::SelectUtxos);
}